

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall
Diffusion::setDomainBC
          (Diffusion *this,array<amrex::LinOpBCType,_3UL> *mlmg_lobc,
          array<amrex::LinOpBCType,_3UL> *mlmg_hibc,int src_comp)

{
  pointer pGVar1;
  StateDescriptor *this_00;
  BCRec *pBVar2;
  uint uVar3;
  LinOpBCType LVar4;
  array<amrex::LinOpBCType,_3UL> *paVar5;
  int idim;
  long lVar6;
  
  lVar6 = 0;
  this_00 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
  pBVar2 = amrex::StateDescriptor::getBC(this_00,src_comp);
  pGVar1 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (*(char *)((long)&pGVar1->super_CoordSys + lVar6 + 0x51) == '\x01') {
      mlmg_hibc->_M_elems[lVar6] = Periodic;
      LVar4 = Periodic;
      paVar5 = mlmg_lobc;
    }
    else {
      uVar3 = pBVar2->bc[lVar6] + 1;
      LVar4 = bogus;
      if (uVar3 < 6) {
        LVar4 = *(LinOpBCType *)(&DAT_0078c510 + (ulong)uVar3 * 4);
      }
      mlmg_lobc->_M_elems[lVar6] = LVar4;
      LVar4 = Neumann;
      paVar5 = mlmg_hibc;
      switch(pBVar2->bc[lVar6 + 3]) {
      default:
        LVar4 = bogus;
        break;
      case 1:
      case 2:
      case 4:
        break;
      case 3:
        LVar4 = Dirichlet;
        break;
      case -1:
        LVar4 = reflect_odd;
      }
    }
    paVar5->_M_elems[lVar6] = LVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return;
}

Assistant:

void
Diffusion::setDomainBC (std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_lobc,
                        std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_hibc,
                        int src_comp)
{
    const BCRec& bc = navier_stokes->get_desc_lst()[State_Type].getBC(src_comp);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (parent->Geom(0).isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else
        {
            int pbc = bc.lo(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_lobc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_lobc[idim] = LinOpBCType::bogus;
            }

            pbc = bc.hi(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_hibc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_hibc[idim] = LinOpBCType::bogus;
            }
        }
    }
}